

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-format.hh
# Opt level: O2

optional<tinyusdz::ListOp<tinyusdz::Path>_> * __thiscall
tinyusdz::crate::CrateValue::get_value<tinyusdz::ListOp<tinyusdz::Path>>
          (optional<tinyusdz::ListOp<tinyusdz::Path>_> *__return_storage_ptr__,CrateValue *this)

{
  optional<tinyusdz::ListOp<tinyusdz::Path>_> local_b0;
  
  tinyusdz::value::Value::get_value<tinyusdz::ListOp<tinyusdz::Path>>(&local_b0,&this->value_,false)
  ;
  nonstd::optional_lite::optional<tinyusdz::ListOp<tinyusdz::Path>_>::
  optional<tinyusdz::ListOp<tinyusdz::Path>,_0>(__return_storage_ptr__,&local_b0);
  nonstd::optional_lite::optional<tinyusdz::ListOp<tinyusdz::Path>_>::~optional(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return value_.get_value<T>();
  }